

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O2

void __thiscall
TlbImport::load(TlbImport *this,istream *stream,config_set *config,Registry *registry)

{
  _Link_type __rhs;
  _Rb_tree_header *__x;
  xmlNodePtr node;
  xmlChar *__rhs_00;
  NodeLoader loader_;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  iterator iVar8;
  ostream *poVar9;
  iterator iVar10;
  _Rb_tree_node_base *this_00;
  _Rb_tree_node_base *p_Var11;
  _Link_type p_Var12;
  runtime_error *this_01;
  MalformedXML *this_02;
  BadRootElement *this_03;
  string *psVar13;
  string *file_;
  _Link_type __rhs_01;
  string *this_04;
  undefined **ppuVar14;
  _xmlNode **pp_Var15;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  allocator local_1a1;
  _Link_type local_1a0;
  long local_198;
  TypeMap all_types;
  _Alloc_hider local_160;
  _Base_ptr p_Stack_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  stringbuf buffer;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  Registry *local_110;
  _Base_ptr local_f8;
  string local_d8;
  Registry *local_b8;
  string document;
  string local_90 [32];
  string type_file;
  string name;
  
  document._M_dataplus._M_p = (pointer)&document.field_2;
  document._M_string_length = 0;
  document.field_2._M_local_buf[0] = '\0';
  psVar13 = (string *)registry;
  while (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    std::__cxx11::stringbuf::stringbuf((stringbuf *)&buffer);
    std::istream::operator>>((istream *)stream,(streambuf *)&buffer);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)&document);
    std::__cxx11::string::~string((string *)&all_types);
    std::__cxx11::stringbuf::~stringbuf((stringbuf *)&buffer);
  }
  local_b8 = registry;
  lVar6 = xmlParseMemory(document._M_dataplus._M_p,document._M_string_length & 0xffffffff);
  if (lVar6 == 0) {
    this_02 = (MalformedXML *)__cxa_allocate_exception(0x60);
    std::__cxx11::string::string((string *)&buffer,"",(allocator *)&all_types);
    Parsing::MalformedXML::MalformedXML(this_02,(string *)&buffer);
    __cxa_throw(this_02,&Parsing::MalformedXML::typeinfo,Typelib::ImportError::~ImportError);
  }
  std::__cxx11::string::string(local_90,"",&local_1a1);
  lVar7 = xmlDocGetRootElement(lVar6);
  if (lVar7 != 0) {
    iVar5 = xmlStrcmp(*(undefined8 *)(lVar7 + 0x10),"typelib");
    local_198 = lVar6;
    if (iVar5 != 0) {
      this_03 = (BadRootElement *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string
                ((string *)&buffer,*(char **)(lVar7 + 0x10),(allocator *)&local_d8);
      std::__cxx11::string::string((string *)&all_types,"typelib",(allocator *)&name);
      std::__cxx11::string::string((string *)&local_160,"",(allocator *)&type_file);
      Parsing::BadRootElement::BadRootElement
                (this_03,(string *)&buffer,(string *)&all_types,(string *)&local_160);
      __cxa_throw(this_03,&Parsing::BadRootElement::typeinfo,
                  Parsing::BadRootElement::~BadRootElement);
    }
    all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &all_types._M_t._M_impl.super__Rb_tree_header._M_header;
    all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    all_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pp_Var15 = (_xmlNode **)(lVar7 + 0x18);
    all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      file_ = &type_file;
      local_128._M_allocated_capacity = (size_type)local_138;
      node = *pp_Var15;
      if (node == (xmlNodePtr)0x0) break;
      iVar5 = xmlStrcmp(node->name,"comment");
      if ((iVar5 != 0) && (iVar5 = xmlStrcmp(node->name,"text"), iVar5 != 0)) {
        (anonymous_namespace)::getStringAttribute_abi_cxx11_
                  (&name,(_anonymous_namespace_ *)node,(xmlNodePtr)"name",(char *)psVar13);
        __rhs_00 = node->name;
        ppuVar14 = &PTR_load_alias_00113778;
        while( true ) {
          if (ppuVar14[-1] == (undefined *)0x0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_d8,"unrecognized XML node \'",(allocator *)&type_file);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_160,&local_d8,(char *)__rhs_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_160,"\'");
            std::runtime_error::runtime_error(this_01,(string *)&buffer);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar5 = xmlStrcmp(__rhs_00);
          if (iVar5 == 0) break;
          ppuVar14 = ppuVar14 + 2;
        }
        loader_ = (NodeLoader)*ppuVar14;
        iVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                ::find(&all_types,(key_type *)&name);
        psVar13 = (string *)&all_types._M_t._M_impl.super__Rb_tree_header;
        if (iVar8._M_node == (_Base_ptr)psVar13) {
          std::__cxx11::string::string((string *)file_,local_90);
          (anonymous_namespace)::getStringAttribute_abi_cxx11_
                    ((string *)&buffer,(_anonymous_namespace_ *)node,(xmlNodePtr)"source_id",
                     (char *)psVar13);
          std::__cxx11::string::operator=((string *)file_,(string *)&buffer);
          std::__cxx11::string::~string((string *)&buffer);
          anon_unknown.dwarf_f480::TypeNode::TypeNode((TypeNode *)&buffer,node,&name,file_,loader_);
          __x = &all_types._M_t._M_impl.super__Rb_tree_header;
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                   ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                     *)all_types._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent,(_Link_type)__x,(_Base_ptr)&name,file_);
          pVar1.second = iVar10._M_node;
          pVar1.first = iVar10._M_node;
          if (((_Rb_tree_header *)iVar10._M_node == __x) ||
             (bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(iVar10._M_node + 1)), bVar4)) {
            this_00 = (_Rb_tree_node_base *)operator_new(0x90);
            local_1a0 = (_Link_type)(this_00 + 1);
            std::__cxx11::string::string((string *)local_1a0,(string *)&name);
            local_160._M_p = (pointer)&local_150;
            p_Stack_158 = (_Base_ptr)0x0;
            local_150._M_allocated_capacity = local_150._M_allocated_capacity & 0xffffffffffffff00;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            local_d8._M_string_length = 0;
            local_d8.field_2._M_local_buf[0] = '\0';
            file_ = &local_d8;
            anon_unknown.dwarf_f480::TypeNode::TypeNode
                      ((TypeNode *)(this_00 + 2),(xmlNodePtr)0x0,(string *)&local_160,&local_d8,
                       (NodeLoader)0x0);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_160);
            p_Var12 = local_1a0;
            if ((_Rb_tree_header *)iVar10._M_node == &all_types._M_t._M_impl.super__Rb_tree_header)
            {
              if ((all_types._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
                 (__rhs_01 = local_1a0,
                 bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(all_types._M_t._M_impl.super__Rb_tree_header._M_header.
                                            _M_right + 1),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1a0), !bVar4)) {
LAB_0010b817:
                pVar16 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                         ::_M_get_insert_unique_pos(&all_types._M_t,(key_type *)p_Var12);
                __rhs_01 = p_Var12;
              }
              else {
LAB_0010b800:
                auVar3._8_8_ = 0;
                auVar3._0_8_ = all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                pVar16 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                         (auVar3 << 0x40);
              }
LAB_0010b81f:
              iVar10._M_node = pVar16.first;
              p_Var12 = __rhs_01;
              if (pVar16.second == (_Rb_tree_node_base *)0x0) {
LAB_0010b864:
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
                                *)this_00,p_Var12);
                goto LAB_0010b877;
              }
            }
            else {
              __rhs = (_Link_type)(iVar10._M_node + 1);
              __rhs_01 = __rhs;
              bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
              if (!bVar4) {
                bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)p_Var12);
                if (bVar4) {
                  __rhs_01 = p_Var12;
                  if (all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                      iVar10._M_node) goto LAB_0010b800;
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar10._M_node);
                  p_Var12 = local_1a0;
                  pVar16.second = p_Var11;
                  pVar16.first = p_Var11;
                  __rhs_01 = (_Link_type)(p_Var11 + 1);
                  bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1a0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__rhs_01);
                  if (!bVar4) goto LAB_0010b817;
                  if ((iVar10._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_0010b7f1;
                  goto LAB_0010b81f;
                }
                goto LAB_0010b864;
              }
              pVar16.second = all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              pVar16.first = all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left == iVar10._M_node)
              goto LAB_0010b81f;
              iVar10._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar10._M_node);
              p_Var12 = local_1a0;
              __rhs_01 = local_1a0;
              bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(iVar10._M_node + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a0);
              if (!bVar4) goto LAB_0010b817;
              pVar16 = pVar1;
              if ((iVar10._M_node)->_M_right != (_Base_ptr)0x0) goto LAB_0010b81f;
LAB_0010b7f1:
              auVar2._8_8_ = 0;
              auVar2._0_8_ = iVar10._M_node;
              pVar16 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar2 << 0x40);
            }
            p_Var11 = pVar16.second;
            bVar4 = true;
            if ((&all_types._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var11) &&
               (pVar16.first == (_Rb_tree_node_base *)0x0)) {
              bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a0,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var11 + 1));
            }
            file_ = (string *)&all_types._M_t._M_impl.super__Rb_tree_header;
            std::_Rb_tree_insert_and_rebalance(bVar4,this_00,p_Var11,(_Rb_tree_node_base *)file_);
            all_types._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 all_types._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
            iVar10._M_node = this_00;
          }
LAB_0010b877:
          *(pointer *)(iVar10._M_node + 2) = _buffer;
          std::__cxx11::string::operator=
                    ((string *)&iVar10._M_node[2]._M_parent,(string *)local_138);
          std::__cxx11::string::operator=
                    ((string *)&iVar10._M_node[3]._M_parent,(string *)&local_118);
          iVar10._M_node[4]._M_parent = local_f8;
          anon_unknown.dwarf_f480::TypeNode::~TypeNode((TypeNode *)&buffer);
          this_04 = &type_file;
        }
        else {
          std::__cxx11::string::string((string *)&buffer,(string *)&iVar8._M_node[3]._M_parent);
          poVar9 = std::operator<<((ostream *)&std::clog,"Type ");
          poVar9 = std::operator<<(poVar9,(string *)&name);
          poVar9 = std::operator<<(poVar9," has already been defined in ");
          poVar9 = std::operator<<(poVar9,(string *)&buffer);
          std::endl<char,std::char_traits<char>>(poVar9);
          poVar9 = std::operator<<((ostream *)&std::clog,"\tThe definition found in ");
          poVar9 = std::operator<<(poVar9,local_90);
          poVar9 = std::operator<<(poVar9," will be ignored");
          std::endl<char,std::char_traits<char>>(poVar9);
          this_04 = (string *)&buffer;
          file_ = psVar13;
        }
        std::__cxx11::string::~string((string *)this_04);
        std::__cxx11::string::~string((string *)&name);
        psVar13 = file_;
      }
      pp_Var15 = &node->next;
    }
    local_138._0_4_ = _S_red;
    local_110 = local_b8;
    local_138._8_8_ = (_Link_type)0x0;
    local_118._M_p = (pointer)0x0;
    local_160._M_p = (pointer)0x0;
    p_Stack_158 = (_Base_ptr)0x0;
    local_150._M_allocated_capacity = (size_type)&buffer;
    local_128._8_8_ = local_128._M_allocated_capacity;
    if (all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var12 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
                ::
                _M_copy<false,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>::_Reuse_or_alloc_node>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>,std::_Select1st<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::TypeNode>>>
                            *)all_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           (_Link_type)local_128._M_allocated_capacity,(_Base_ptr)&local_160,
                           (_Reuse_or_alloc_node *)psVar13);
      local_128._M_allocated_capacity =
           (size_type)std::_Rb_tree_node_base::_S_minimum(&p_Var12->super__Rb_tree_node_base);
      local_128._8_8_ =
           std::_Rb_tree_node_base::_S_maximum((_Base_ptr)local_128._M_allocated_capacity);
      local_118._M_p = (pointer)all_types._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_138._8_8_ = p_Var12;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::_Reuse_or_alloc_node::~_Reuse_or_alloc_node((_Reuse_or_alloc_node *)&local_160);
    while (local_118._M_p != (pointer)0x0) {
      std::__cxx11::string::string((string *)&local_160,(string *)(local_128._0_8_ + 0x20));
      anon_unknown.dwarf_f480::Factory::build((Factory *)&buffer,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
            *)&buffer);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::TypeNode>_>_>
    ::~map(&all_types);
    lVar6 = local_198;
  }
  std::__cxx11::string::~string(local_90);
  xmlFreeDoc(lVar6);
  std::__cxx11::string::~string((string *)&document);
  return;
}

Assistant:

void TlbImport::load
    ( std::istream& stream
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // libXML is not really iostream-compatible :(
    // Get the whole document
    std::string document;

    while (stream.good())
    {
        std::stringbuf buffer;
        stream >> &buffer;
        document += buffer.str();
    }
    xmlDocPtr doc = xmlParseMemory(document.c_str(), document.length());
    if (!doc)
        throw Parsing::MalformedXML();

    try
    {
        // giving "" as source_id is rather counterproductive... later
        // errormessages are not informative anymore...
        parse("", doc, registry);
        xmlFreeDoc(doc);
    }
    catch(...)
    {
        xmlFreeDoc(doc);
        throw;
    }
}